

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

void Diligent::GetAllowedStagesAndAccessMask
               (BIND_FLAGS Flags,VkPipelineStageFlags *StageMask,VkAccessFlags *AccessMask)

{
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  BIND_FLAGS FlagBit;
  VkAccessFlags *AccessMask_local;
  VkPipelineStageFlags *StageMask_local;
  BIND_FLAGS Flags_local;
  
  *StageMask = 0x1000;
  *AccessMask = 0x1800;
  StageMask_local._4_4_ = Flags;
LAB_0035b297:
  if (StageMask_local._4_4_ == BIND_NONE) {
    return;
  }
  msg.field_2._12_4_ = ExtractLSB<Diligent::BIND_FLAGS>((BIND_FLAGS *)((long)&StageMask_local + 4));
  if (msg.field_2._12_4_ != BIND_NONE) {
    if (msg.field_2._12_4_ == BIND_VERTEX_BUFFER) {
      *StageMask = *StageMask | 4;
      *AccessMask = *AccessMask | 4;
      goto LAB_0035b297;
    }
    if (msg.field_2._12_4_ == BIND_INDEX_BUFFER) {
      *StageMask = *StageMask | 4;
      *AccessMask = *AccessMask | 2;
      goto LAB_0035b297;
    }
    if (msg.field_2._12_4_ == BIND_UNIFORM_BUFFER) {
      *StageMask = *StageMask | 0x3808f8;
      *AccessMask = *AccessMask | 8;
      goto LAB_0035b297;
    }
    if (msg.field_2._12_4_ == BIND_SHADER_RESOURCE) {
      *StageMask = *StageMask | 0x3808f8;
      *AccessMask = *AccessMask | 0x20;
      goto LAB_0035b297;
    }
    if (msg.field_2._12_4_ != BIND_STREAM_OUTPUT) {
      if (msg.field_2._12_4_ == BIND_RENDER_TARGET) {
        *StageMask = *StageMask | 0x400;
        *AccessMask = *AccessMask | 0x180;
      }
      else if (msg.field_2._12_4_ == BIND_DEPTH_STENCIL) {
        *StageMask = *StageMask | 0x300;
        *AccessMask = *AccessMask | 0x600;
      }
      else if (msg.field_2._12_4_ == BIND_UNORDERED_ACCESS) {
        *StageMask = *StageMask | 0x3808f8;
        *AccessMask = *AccessMask | 0x60;
      }
      else if (msg.field_2._12_4_ == BIND_INDIRECT_DRAW_ARGS) {
        *StageMask = *StageMask | 2;
        *AccessMask = *AccessMask | 1;
      }
      else if (msg.field_2._12_4_ == BIND_INPUT_ATTACHMENT) {
        *StageMask = *StageMask | 0x80;
        *AccessMask = *AccessMask | 0x10;
      }
      else if (msg.field_2._12_4_ == BIND_RAY_TRACING) {
        *StageMask = *StageMask | 0x2200000;
        *AccessMask = *AccessMask | 0x600000;
      }
      else {
        if (msg.field_2._12_4_ != BIND_FLAG_LAST) goto LAB_0035b4bd;
        *StageMask = *StageMask | 0xc00000;
        *AccessMask = *AccessMask | 0x1800000;
      }
      goto LAB_0035b297;
    }
  }
LAB_0035b4bd:
  FormatString<char[21]>((string *)local_48,(char (*) [21])"Unexpected bind flag");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"GetAllowedStagesAndAccessMask",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
             ,0x8a1);
  std::__cxx11::string::~string((string *)local_48);
  goto LAB_0035b297;
}

Assistant:

void GetAllowedStagesAndAccessMask(BIND_FLAGS Flags, VkPipelineStageFlags& StageMask, VkAccessFlags& AccessMask)
{
    StageMask  = VK_PIPELINE_STAGE_TRANSFER_BIT;
    AccessMask = VK_ACCESS_TRANSFER_READ_BIT | VK_ACCESS_TRANSFER_WRITE_BIT;
    while (Flags != BIND_NONE)
    {
        BIND_FLAGS FlagBit = ExtractLSB(Flags);
        static_assert(BIND_FLAG_LAST == (1u << 11), "This function must be updated to handle new bind flag");
        switch (FlagBit)
        {
            case BIND_VERTEX_BUFFER:
                StageMask |= VK_PIPELINE_STAGE_VERTEX_INPUT_BIT;
                AccessMask |= VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT;
                break;
            case BIND_INDEX_BUFFER:
                StageMask |= VK_PIPELINE_STAGE_VERTEX_INPUT_BIT;
                AccessMask |= VK_ACCESS_INDEX_READ_BIT;
                break;
            case BIND_UNIFORM_BUFFER:
                StageMask |= VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
                AccessMask |= VK_ACCESS_UNIFORM_READ_BIT;
                break;
            case BIND_SHADER_RESOURCE:
                StageMask |= VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
                AccessMask |= VK_ACCESS_SHADER_READ_BIT;
                break;
            case BIND_RENDER_TARGET:
                StageMask |= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
                AccessMask |= VK_ACCESS_COLOR_ATTACHMENT_READ_BIT | VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
                break;
            case BIND_DEPTH_STENCIL:
                StageMask |= VK_PIPELINE_STAGE_EARLY_FRAGMENT_TESTS_BIT | VK_PIPELINE_STAGE_LATE_FRAGMENT_TESTS_BIT;
                AccessMask |= VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT | VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
                break;
            case BIND_UNORDERED_ACCESS:
                StageMask |= VulkanUtilities::VK_PIPELINE_STAGE_ALL_SHADERS;
                AccessMask |= VK_ACCESS_SHADER_READ_BIT | VK_ACCESS_SHADER_WRITE_BIT;
                break;
            case BIND_INDIRECT_DRAW_ARGS:
                StageMask |= VK_PIPELINE_STAGE_DRAW_INDIRECT_BIT;
                AccessMask |= VK_ACCESS_INDIRECT_COMMAND_READ_BIT;
                break;
            case BIND_INPUT_ATTACHMENT:
                StageMask |= VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT;
                AccessMask |= VK_ACCESS_INPUT_ATTACHMENT_READ_BIT;
                break;
            case BIND_RAY_TRACING:
                StageMask |= VK_PIPELINE_STAGE_ACCELERATION_STRUCTURE_BUILD_BIT_KHR | VK_PIPELINE_STAGE_RAY_TRACING_SHADER_BIT_KHR;
                AccessMask |= VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR | VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR;
                break;
            case BIND_SHADING_RATE:
                StageMask |= VK_PIPELINE_STAGE_FRAGMENT_DENSITY_PROCESS_BIT_EXT | VK_PIPELINE_STAGE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
                AccessMask |= VK_ACCESS_FRAGMENT_DENSITY_MAP_READ_BIT_EXT | VK_ACCESS_FRAGMENT_SHADING_RATE_ATTACHMENT_READ_BIT_KHR;
                break;

            case BIND_NONE:
            case BIND_STREAM_OUTPUT:
            default:
                UNEXPECTED("Unexpected bind flag");
                break;
        }
    }
}